

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O0

int __thiscall MeCab::Param::open(Param *this,char *__file,int __oflag,...)

{
  char *__src;
  undefined1 uVar1;
  int iVar2;
  char *__dest;
  size_t __n;
  undefined8 extraout_RAX;
  uint uVar3;
  char *p;
  uint size;
  char *ptr [64];
  scoped_fixed_array<char,_8192> str;
  undefined6 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd76;
  byte in_stack_fffffffffffffd77;
  char *local_258;
  uint local_24c;
  char *local_248 [67];
  scoped_fixed_array<char,_8192> local_30;
  undefined8 local_18;
  char *local_10;
  Param *local_8;
  
  local_18 = ___oflag;
  local_10 = __file;
  local_8 = this;
  scoped_fixed_array<char,_8192>::scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)
             CONCAT17(in_stack_fffffffffffffd77,
                      CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)));
  __dest = scoped_fixed_array<char,_8192>::get(&local_30);
  __src = local_10;
  __n = scoped_fixed_array<char,_8192>::size(&local_30);
  strncpy(__dest,__src,__n);
  local_24c = 1;
  local_248[0] = "open_jtalk";
  local_258 = scoped_fixed_array<char,_8192>::get(&local_30);
  while (*local_258 != '\0') {
    while (iVar2 = isspace((int)*local_258), iVar2 != 0) {
      *local_258 = '\0';
      local_258 = local_258 + 1;
    }
    if (*local_258 == '\0') break;
    uVar3 = local_24c + 1;
    local_248[local_24c] = local_258;
    local_24c = uVar3;
    if (uVar3 == 0x200) break;
    while( true ) {
      in_stack_fffffffffffffd77 = 0;
      if (*local_258 != '\0') {
        iVar2 = isspace((int)*local_258);
        in_stack_fffffffffffffd77 = iVar2 != 0 ^ 0xff;
      }
      if ((in_stack_fffffffffffffd77 & 1) == 0) break;
      local_258 = local_258 + 1;
    }
  }
  iVar2 = open(this,(char *)(ulong)local_24c,(int)local_248,local_18);
  uVar1 = (undefined1)iVar2;
  scoped_fixed_array<char,_8192>::~scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)
             CONCAT17(in_stack_fffffffffffffd77,CONCAT16(uVar1,in_stack_fffffffffffffd70)));
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),uVar1) & 0xffffff01;
}

Assistant:

bool Param::open(const char *arg, const Option *opts) {
  scoped_fixed_array<char, BUF_SIZE> str;
  std::strncpy(str.get(), arg, str.size());
  char* ptr[64];
  unsigned int size = 1;
  ptr[0] = const_cast<char*>(PACKAGE);

  for (char *p = str.get(); *p;) {
    while (isspace(*p)) *p++ = '\0';
    if (*p == '\0') break;
    ptr[size++] = p;
    if (size == sizeof(ptr)) break;
    while (*p && !isspace(*p)) p++;
  }

  return open(size, ptr, opts);
}